

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

void __thiscall
cmCTestVC::WriteXMLEntry
          (cmCTestVC *this,cmXMLWriter *xml,string *path,string *name,string *full,File *f)

{
  char *pcVar1;
  Revision *local_290;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  byte local_62;
  allocator local_61;
  undefined1 local_60 [8];
  string prior;
  Revision *rev;
  File *f_local;
  string *full_local;
  string *name_local;
  string *path_local;
  cmXMLWriter *xml_local;
  cmCTestVC *this_local;
  
  if (f->Rev == (Revision *)0x0) {
    local_290 = &this->Unknown;
  }
  else {
    local_290 = f->Rev;
  }
  prior.field_2._8_8_ = local_290;
  local_62 = 0;
  if (f->PriorRev == (Revision *)0x0) {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string((string *)local_60,"Unknown",&local_61);
  }
  else {
    std::__cxx11::string::string((string *)local_60,(string *)f->PriorRev);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  pcVar1 = WriteXMLEntry::desc[f->Status];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
  cmXMLWriter::StartElement(xml,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"File",&local_c1);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_c0,name);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"Directory",&local_e9);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_e8,path);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"FullName",&local_111);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_110,full);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"CheckinDate",&local_139);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0x20));
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"Author",&local_161);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0x40));
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"Email",&local_189);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_188,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0x60));
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"Committer",&local_1b1);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0x80));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"CommitterEmail",&local_1d9);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0xa0));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"CommitDate",&local_201);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0xc0));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"Log",&local_229);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prior.field_2._8_8_ + 0xe0));
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"Revision",&local_251);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_250,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             prior.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"PriorRevision",&local_279);
  cmXMLWriter::Element<std::__cxx11::string>
            (xml,&local_278,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  cmXMLWriter::EndElement(xml);
  this->PathCount[f->Status] = this->PathCount[f->Status] + 1;
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmCTestVC::WriteXMLEntry(cmXMLWriter& xml,
                              std::string const& path,
                              std::string const& name,
                              std::string const& full,
                              File const& f)
{
  static const char* desc[3] = { "Updated", "Modified", "Conflicting"};
  Revision const& rev = f.Rev? *f.Rev : this->Unknown;
  std::string prior = f.PriorRev? f.PriorRev->Rev : std::string("Unknown");
  xml.StartElement(desc[f.Status]);
  xml.Element("File", name);
  xml.Element("Directory", path);
  xml.Element("FullName", full);
  xml.Element("CheckinDate", rev.Date);
  xml.Element("Author", rev.Author);
  xml.Element("Email", rev.EMail);
  xml.Element("Committer", rev.Committer);
  xml.Element("CommitterEmail", rev.CommitterEMail);
  xml.Element("CommitDate", rev.CommitDate);
  xml.Element("Log", rev.Log);
  xml.Element("Revision", rev.Rev);
  xml.Element("PriorRevision", prior);
  xml.EndElement();
  ++this->PathCount[f.Status];
}